

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Chooser.cxx
# Opt level: O2

void __thiscall
Fl_File_Chooser::Fl_File_Chooser(Fl_File_Chooser *this,char *d,char *p,int t,char *title)

{
  uint *puVar1;
  Fl_Button *pFVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Fl_Preferences *this_00;
  Fl_Group *g;
  Fl_Double_Window *pFVar7;
  Fl_Group *pFVar8;
  Fl_Choice *this_01;
  Fl_Group *pFVar9;
  Fl_Widget *pFVar10;
  Fl_Button *pFVar11;
  Fl_File_Browser *pFVar12;
  Fl_Window *pFVar13;
  Fl_Box *this_02;
  Fl_Group *pFVar14;
  Fl_File_Input *pFVar15;
  Fl_Bitmap *this_03;
  int e;
  
  if (prefs_ == (Fl_Preferences *)0x0) {
    this_00 = (Fl_Preferences *)operator_new(0x18);
    Fl_Preferences::Fl_Preferences(this_00,USER,"fltk.org","filechooser");
    prefs_ = this_00;
  }
  g = Fl_Group::current();
  pFVar7 = (Fl_Double_Window *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window(pFVar7,0x1ea,0x17c,"Choose File");
  this->window = pFVar7;
  (pFVar7->super_Fl_Window).super_Fl_Group.super_Fl_Widget.callback_ = cb_window;
  (pFVar7->super_Fl_Window).super_Fl_Group.super_Fl_Widget.user_data_ = this;
  pFVar8 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar8,10,10,0x1d6,0x19,(char *)0x0);
  this_01 = (Fl_Choice *)operator_new(0x98);
  Fl_Choice::Fl_Choice(this_01,0x41,10,0xd7,0x19,"Show:");
  this->showChoice = this_01;
  (this_01->super_Fl_Menu_).down_box_ = '\x0e';
  (this_01->super_Fl_Menu_).super_Fl_Widget.label_.font = 1;
  (this_01->super_Fl_Menu_).super_Fl_Widget.callback_ = cb_showChoice;
  pFVar9 = Fl_Group::current();
  pFVar10 = (Fl_Widget *)this->showChoice;
  pFVar9->resizable_ = pFVar10;
  Fl_Widget::label(pFVar10,show_label);
  pFVar10 = (Fl_Widget *)operator_new(0x98);
  Fl_Menu_Button::Fl_Menu_Button((Fl_Menu_Button *)pFVar10,0x122,10,0x9b,0x19,"Favorites");
  this->favoritesButton = (Fl_Menu_Button *)pFVar10;
  *(undefined1 *)((long)&pFVar10[1].callback_ + 1) = 0xe;
  pFVar10->callback_ = cb_favoritesButton;
  (pFVar10->label_).align_ = 0x14;
  Fl_Widget::label(pFVar10,favorites_label);
  pFVar11 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar11,0x1c7,10,0x19,0x19,(char *)0x0);
  this->newButton = pFVar11;
  if (image_new()::image == '\0') {
    iVar6 = __cxa_guard_acquire(&image_new()::image);
    if (iVar6 != 0) {
      this_03 = (Fl_Bitmap *)operator_new(0x38);
      Fl_Bitmap::Fl_Bitmap(this_03,"",0x10,0x10);
      image_new()::image = this_03;
      __cxa_guard_release(&image_new()::image);
    }
  }
  (pFVar11->super_Fl_Widget).label_.image = &image_new()::image->super_Fl_Image;
  pFVar2 = this->newButton;
  (pFVar2->super_Fl_Widget).label_.size = 8;
  (pFVar2->super_Fl_Widget).callback_ = cb_newButton;
  Fl_Widget::tooltip((Fl_Widget *)pFVar11,new_directory_tooltip);
  Fl_Group::end(pFVar8);
  pFVar8 = (Fl_Group *)operator_new(0xa0);
  Fl_Tile::Fl_Tile((Fl_Tile *)pFVar8,10,0x2d,0x1d6,0xe1,(char *)0x0);
  (pFVar8->super_Fl_Widget).callback_ = cb_;
  pFVar12 = (Fl_File_Browser *)operator_new(0x2b8);
  Fl_File_Browser::Fl_File_Browser(pFVar12,10,0x2d,0x127,0xe1,(char *)0x0);
  this->fileList = pFVar12;
  (pFVar12->super_Fl_Browser).super_Fl_Browser_.super_Fl_Group.super_Fl_Widget.type_ = '\x02';
  (pFVar12->super_Fl_Browser).super_Fl_Browser_.super_Fl_Group.super_Fl_Widget.callback_ =
       cb_fileList;
  pFVar13 = Fl_Widget::window((Fl_Widget *)pFVar12);
  Fl_Window::hotspot(pFVar13,(Fl_Widget *)this->fileList,0);
  this_02 = (Fl_Box *)operator_new(0x78);
  Fl_Box::Fl_Box(this_02,0x131,0x2d,0xaf,0xe1,"?");
  this->previewBox = this_02;
  (this_02->super_Fl_Widget).box_ = '\x03';
  (this_02->super_Fl_Widget).label_.size = 100;
  (this_02->super_Fl_Widget).label_.align_ = 0x50;
  Fl_Group::end(pFVar8);
  pFVar9 = Fl_Group::current();
  pFVar9->resizable_ = (Fl_Widget *)pFVar8;
  pFVar8 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar8,10,0x113,0x1d6,0x5f,(char *)0x0);
  pFVar9 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar9,10,0x113,0x1d6,0x14,(char *)0x0);
  pFVar11 = (Fl_Button *)operator_new(0x80);
  Fl_Check_Button::Fl_Check_Button((Fl_Check_Button *)pFVar11,10,0x113,0x49,0x14,"Preview");
  this->previewButton = (Fl_Check_Button *)pFVar11;
  pFVar11->shortcut_ = 0x80070;
  pFVar11->down_box_ = '\x03';
  Fl_Button::value(pFVar11,1);
  pFVar10 = (Fl_Widget *)this->previewButton;
  pFVar10->callback_ = cb_previewButton;
  Fl_Widget::label(pFVar10,preview_label);
  pFVar10 = (Fl_Widget *)operator_new(0x80);
  Fl_Check_Button::Fl_Check_Button
            ((Fl_Check_Button *)pFVar10,0x73,0x113,0xa5,0x14,"Show hidden files");
  this->showHiddenButton = (Fl_Check_Button *)pFVar10;
  *(undefined1 *)((long)&pFVar10[1]._vptr_Fl_Widget + 6) = 3;
  pFVar10->callback_ = cb_showHiddenButton;
  Fl_Widget::label(pFVar10,hidden_label);
  pFVar10 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar10,0x73,0x113,0x16d,0x14,(char *)0x0);
  pFVar14 = Fl_Group::current();
  pFVar14->resizable_ = pFVar10;
  Fl_Group::end(pFVar9);
  pFVar15 = (Fl_File_Input *)operator_new(0x260);
  Fl_File_Input::Fl_File_Input(pFVar15,0x73,300,0x16d,0x23,(char *)0x0);
  this->fileName = pFVar15;
  (pFVar15->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.label_.font = 1;
  (pFVar15->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.callback_ = cb_fileName;
  (pFVar15->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.when_ = '\b';
  pFVar9 = Fl_Group::current();
  pFVar15 = this->fileName;
  pFVar9->resizable_ = (Fl_Widget *)pFVar15;
  (pFVar15->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.when_ = '\v';
  pFVar10 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar10,10,0x136,0x69,0x19,"Filename:");
  (pFVar10->label_).font = 1;
  (pFVar10->label_).align_ = 0x18;
  Fl_Widget::label(pFVar10,filename_label);
  pFVar9 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar9,10,0x159,0x1d6,0x19,(char *)0x0);
  pFVar10 = (Fl_Widget *)operator_new(0x80);
  Fl_Return_Button::Fl_Return_Button((Fl_Return_Button *)pFVar10,0x139,0x159,0x55,0x19,"OK");
  this->okButton = (Fl_Return_Button *)pFVar10;
  pFVar10->callback_ = cb_okButton;
  Fl_Widget::label(pFVar10,fl_ok);
  pFVar11 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar11,0x198,0x159,0x48,0x19,"Cancel");
  this->cancelButton = pFVar11;
  (pFVar11->super_Fl_Widget).callback_ = cb_cancelButton;
  Fl_Widget::label((Fl_Widget *)pFVar11,fl_cancel);
  pFVar10 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar10,10,0x159,0x1e,0x19,(char *)0x0);
  pFVar14 = Fl_Group::current();
  pFVar14->resizable_ = pFVar10;
  Fl_Group::end(pFVar9);
  Fl_Group::end(pFVar8);
  if (title != (char *)0x0) {
    Fl_Window::label(&this->window->super_Fl_Window,title);
  }
  pFVar8 = (Fl_Group *)this->window;
  puVar1 = &(pFVar8->super_Fl_Widget).flags_;
  *puVar1 = *puVar1 | 0x4000;
  Fl_Group::end(pFVar8);
  pFVar7 = (Fl_Double_Window *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window(pFVar7,0x163,0x96,"Manage Favorites");
  this->favWindow = pFVar7;
  (pFVar7->super_Fl_Window).super_Fl_Group.super_Fl_Widget.user_data_ = this;
  pFVar12 = (Fl_File_Browser *)operator_new(0x2b8);
  Fl_File_Browser::Fl_File_Browser(pFVar12,10,10,300,0x5f,(char *)0x0);
  this->favList = pFVar12;
  (pFVar12->super_Fl_Browser).super_Fl_Browser_.super_Fl_Group.super_Fl_Widget.type_ = '\x02';
  (pFVar12->super_Fl_Browser).super_Fl_Browser_.super_Fl_Group.super_Fl_Widget.callback_ =
       cb_favList;
  pFVar8 = Fl_Group::current();
  pFVar8->resizable_ = (Fl_Widget *)this->favList;
  pFVar8 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar8,0x140,10,0x19,0x5f,(char *)0x0);
  pFVar11 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar11,0x140,10,0x19,0x19,"@8>");
  this->favUpButton = pFVar11;
  (pFVar11->super_Fl_Widget).callback_ = cb_favUpButton;
  pFVar11 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar11,0x140,0x2d,0x19,0x19,"X");
  this->favDeleteButton = pFVar11;
  (pFVar11->super_Fl_Widget).label_.font = 1;
  (pFVar11->super_Fl_Widget).callback_ = cb_favDeleteButton;
  pFVar9 = Fl_Group::current();
  pFVar9->resizable_ = &this->favDeleteButton->super_Fl_Widget;
  pFVar11 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar11,0x140,0x50,0x19,0x19,"@2>");
  this->favDownButton = pFVar11;
  (pFVar11->super_Fl_Widget).callback_ = cb_favDownButton;
  Fl_Group::end(pFVar8);
  pFVar8 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar8,10,0x71,0x14f,0x1d,(char *)0x0);
  pFVar11 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar11,0x111,0x73,0x48,0x19,"Cancel");
  this->favCancelButton = pFVar11;
  (pFVar11->super_Fl_Widget).callback_ = cb_favCancelButton;
  Fl_Widget::label((Fl_Widget *)pFVar11,fl_cancel);
  pFVar10 = (Fl_Widget *)operator_new(0x80);
  Fl_Return_Button::Fl_Return_Button((Fl_Return_Button *)pFVar10,0xb5,0x73,0x4f,0x19,"Save");
  this->favOkButton = (Fl_Return_Button *)pFVar10;
  pFVar10->callback_ = cb_favOkButton;
  Fl_Widget::label(pFVar10,save_label);
  pFVar10 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar10,10,0x73,0xa1,0x19,(char *)0x0);
  pFVar9 = Fl_Group::current();
  pFVar9->resizable_ = pFVar10;
  Fl_Group::end(pFVar8);
  Fl_Window::label(&this->favWindow->super_Fl_Window,manage_favorites_label);
  pFVar13 = &this->favWindow->super_Fl_Window;
  puVar1 = &(pFVar13->super_Fl_Group).super_Fl_Widget.flags_;
  *puVar1 = *puVar1 | 0x4000;
  pFVar13->minw = 0xb5;
  pFVar13->minh = 0x96;
  pFVar13->maxw = 0;
  pFVar13->maxh = 0;
  pFVar13->dw = 0;
  pFVar13->dh = 0;
  pFVar13->aspect = 0;
  Fl_Window::size_range_(pFVar13);
  Fl_Group::end((Fl_Group *)this->favWindow);
  this->callback_ = (_func_void_Fl_File_Chooser_ptr_void_ptr *)0x0;
  this->data_ = (void *)0x0;
  this->directory_[0] = '\0';
  pFVar13 = &this->window->super_Fl_Window;
  iVar6 = (pFVar13->super_Fl_Group).super_Fl_Widget.w_;
  iVar3 = (pFVar13->super_Fl_Group).super_Fl_Widget.h_;
  iVar4 = Fl::w();
  iVar5 = Fl::h();
  pFVar13->minw = iVar6;
  pFVar13->minh = iVar3;
  pFVar13->maxw = iVar4;
  pFVar13->maxh = iVar5;
  pFVar13->dw = 0;
  pFVar13->dh = 0;
  pFVar13->aspect = 0;
  Fl_Window::size_range_(pFVar13);
  type(this,t);
  filter(this,p);
  update_favorites(this);
  value(this,d);
  type(this,t);
  Fl_Preferences::get(prefs_,"preview",&e,1);
  preview(this,e);
  Fl_Group::current(g);
  this->ext_group = (Fl_Widget *)0x0;
  return;
}

Assistant:

Fl_File_Chooser::Fl_File_Chooser(const char *d, const char *p, int t, const char *title) {
  if (!prefs_) {
    prefs_ = new Fl_Preferences(Fl_Preferences::USER, "fltk.org", "filechooser");
  }
  Fl_Group *prev_current = Fl_Group::current();
  { window = new Fl_Double_Window(490, 380, "Choose File");
    window->callback((Fl_Callback*)cb_window, (void*)(this));
    { Fl_Group* o = new Fl_Group(10, 10, 470, 25);
      { showChoice = new Fl_Choice(65, 10, 215, 25, "Show:");
        showChoice->down_box(FL_BORDER_BOX);
        showChoice->labelfont(1);
        showChoice->callback((Fl_Callback*)cb_showChoice);
        Fl_Group::current()->resizable(showChoice);
        showChoice->label(show_label);
      } // Fl_Choice* showChoice
      { favoritesButton = new Fl_Menu_Button(290, 10, 155, 25, "Favorites");
        favoritesButton->down_box(FL_BORDER_BOX);
        favoritesButton->callback((Fl_Callback*)cb_favoritesButton);
        favoritesButton->align(Fl_Align(FL_ALIGN_LEFT|FL_ALIGN_INSIDE));
        favoritesButton->label(favorites_label);
      } // Fl_Menu_Button* favoritesButton
      { Fl_Button* o = newButton = new Fl_Button(455, 10, 25, 25);
        newButton->image( image_new() );
        newButton->labelsize(8);
        newButton->callback((Fl_Callback*)cb_newButton);
        o->tooltip(new_directory_tooltip);
      } // Fl_Button* newButton
      o->end();
    } // Fl_Group* o
    { Fl_Tile* o = new Fl_Tile(10, 45, 470, 225);
      o->callback((Fl_Callback*)cb_);
      { fileList = new Fl_File_Browser(10, 45, 295, 225);
        fileList->type(2);
        fileList->callback((Fl_Callback*)cb_fileList);
        fileList->window()->hotspot(fileList);
      } // Fl_File_Browser* fileList
      { previewBox = new Fl_Box(305, 45, 175, 225, "?");
        previewBox->box(FL_DOWN_BOX);
        previewBox->labelsize(100);
        previewBox->align(Fl_Align(FL_ALIGN_CLIP|FL_ALIGN_INSIDE));
      } // Fl_Box* previewBox
      o->end();
      Fl_Group::current()->resizable(o);
    } // Fl_Tile* o
    { Fl_Group* o = new Fl_Group(10, 275, 470, 95);
      { Fl_Group* o = new Fl_Group(10, 275, 470, 20);
        { previewButton = new Fl_Check_Button(10, 275, 73, 20, "Preview");
          previewButton->shortcut(0x80070);
          previewButton->down_box(FL_DOWN_BOX);
          previewButton->value(1);
          previewButton->callback((Fl_Callback*)cb_previewButton);
          previewButton->label(preview_label);
        } // Fl_Check_Button* previewButton
        { showHiddenButton = new Fl_Check_Button(115, 275, 165, 20, "Show hidden files");
          showHiddenButton->down_box(FL_DOWN_BOX);
          showHiddenButton->callback((Fl_Callback*)cb_showHiddenButton);
          showHiddenButton->label(hidden_label);
        } // Fl_Check_Button* showHiddenButton
        { Fl_Box* o = new Fl_Box(115, 275, 365, 20);
          Fl_Group::current()->resizable(o);
        } // Fl_Box* o
        o->end();
      } // Fl_Group* o
      { fileName = new Fl_File_Input(115, 300, 365, 35);
        fileName->labelfont(1);
        fileName->callback((Fl_Callback*)cb_fileName);
        fileName->when(FL_WHEN_ENTER_KEY);
        Fl_Group::current()->resizable(fileName);
        fileName->when(FL_WHEN_CHANGED | FL_WHEN_ENTER_KEY_ALWAYS);
      } // Fl_File_Input* fileName
      { Fl_Box* o = new Fl_Box(10, 310, 105, 25, "Filename:");
        o->labelfont(1);
        o->align(Fl_Align(FL_ALIGN_RIGHT|FL_ALIGN_INSIDE));
        o->label(filename_label);
      } // Fl_Box* o
      { Fl_Group* o = new Fl_Group(10, 345, 470, 25);
        { okButton = new Fl_Return_Button(313, 345, 85, 25, "OK");
          okButton->callback((Fl_Callback*)cb_okButton);
          okButton->label(fl_ok);
        } // Fl_Return_Button* okButton
        { Fl_Button* o = cancelButton = new Fl_Button(408, 345, 72, 25, "Cancel");
          cancelButton->callback((Fl_Callback*)cb_cancelButton);
          o->label(fl_cancel);
        } // Fl_Button* cancelButton
        { Fl_Box* o = new Fl_Box(10, 345, 30, 25);
          Fl_Group::current()->resizable(o);
        } // Fl_Box* o
        o->end();
      } // Fl_Group* o
      o->end();
    } // Fl_Group* o
    if (title) window->label(title);
    window->set_modal();
    window->end();
  } // Fl_Double_Window* window
  { favWindow = new Fl_Double_Window(355, 150, "Manage Favorites");
    favWindow->user_data((void*)(this));
    { favList = new Fl_File_Browser(10, 10, 300, 95);
      favList->type(2);
      favList->callback((Fl_Callback*)cb_favList);
      Fl_Group::current()->resizable(favList);
    } // Fl_File_Browser* favList
    { Fl_Group* o = new Fl_Group(320, 10, 25, 95);
      { favUpButton = new Fl_Button(320, 10, 25, 25, "@8>");
        favUpButton->callback((Fl_Callback*)cb_favUpButton);
      } // Fl_Button* favUpButton
      { favDeleteButton = new Fl_Button(320, 45, 25, 25, "X");
        favDeleteButton->labelfont(1);
        favDeleteButton->callback((Fl_Callback*)cb_favDeleteButton);
        Fl_Group::current()->resizable(favDeleteButton);
      } // Fl_Button* favDeleteButton
      { favDownButton = new Fl_Button(320, 80, 25, 25, "@2>");
        favDownButton->callback((Fl_Callback*)cb_favDownButton);
      } // Fl_Button* favDownButton
      o->end();
    } // Fl_Group* o
    { Fl_Group* o = new Fl_Group(10, 113, 335, 29);
      { favCancelButton = new Fl_Button(273, 115, 72, 25, "Cancel");
        favCancelButton->callback((Fl_Callback*)cb_favCancelButton);
        favCancelButton->label(fl_cancel);
      } // Fl_Button* favCancelButton
      { favOkButton = new Fl_Return_Button(181, 115, 79, 25, "Save");
        favOkButton->callback((Fl_Callback*)cb_favOkButton);
        favOkButton->label(save_label);
      } // Fl_Return_Button* favOkButton
      { Fl_Box* o = new Fl_Box(10, 115, 161, 25);
        Fl_Group::current()->resizable(o);
      } // Fl_Box* o
      o->end();
    } // Fl_Group* o
    favWindow->label(manage_favorites_label);
    favWindow->set_modal();
    favWindow->size_range(181, 150);
    favWindow->end();
  } // Fl_Double_Window* favWindow
  callback_ = 0;
  data_ = 0;
  directory_[0] = 0;
  window->size_range(window->w(), window->h(), Fl::w(), Fl::h());
  type(t);
  filter(p);
  update_favorites();
  value(d);
  type(t);
  int e;
  prefs_->get("preview", e, 1);
  preview(e);
  Fl_Group::current(prev_current);
  ext_group=(Fl_Widget*)0;
}